

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O3

vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
text_subtitles::TextSubtitlesRender::processTxtLine
          (vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,TextSubtitlesRender *this,string *line,
          vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *fontStack)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  pointer ppVar4;
  double dVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  wint_t wVar10;
  int iVar11;
  uint32_t uVar12;
  int32_t iVar13;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  size_t sVar14;
  const_iterator cVar15;
  pointer ppVar16;
  pointer pFVar17;
  ulong uVar18;
  ulong uVar19;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string *psVar20;
  double dVar21;
  string arg;
  string ltagStr;
  string tagStr;
  ulong local_110;
  string local_108;
  string local_e8;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *local_c8;
  undefined1 local_c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
  *local_80;
  ulong local_78;
  value_type local_70;
  TextSubtitlesRender *local_38;
  
  pFVar17 = (fontStack->
            super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  local_c8 = fontStack;
  if ((fontStack->super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
      _M_impl.super__Vector_impl_data._M_start == pFVar17) {
    std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::push_back
              (fontStack,&this->m_font);
    ((fontStack->super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
     _M_impl.super__Vector_impl_data._M_start)->m_size = 3;
    pFVar17 = (fontStack->
              super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
  local_70.m_name._M_dataplus._M_p = (pointer)&local_70.m_name.field_2;
  pcVar3 = pFVar17[-1].m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + pFVar17[-1].m_name._M_string_length);
  local_70.m_color = pFVar17[-1].m_color;
  local_70.m_lineSpacing = pFVar17[-1].m_lineSpacing;
  local_70.m_size = pFVar17[-1].m_size;
  local_70.m_opts = pFVar17[-1].m_opts;
  local_70.m_borderWidth = pFVar17[-1].m_borderWidth;
  local_70.m_charset = pFVar17[-1].m_charset;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar19 = line->_M_string_length;
  if (uVar19 != 0) {
    local_110 = 0;
    local_78 = 0;
    bVar9 = false;
    uVar18 = 0;
    local_80 = (vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
                *)__return_storage_ptr__;
    local_38 = this;
    do {
      cVar2 = (line->_M_dataplus)._M_p[uVar18];
      if (cVar2 == '<') {
        bVar9 = true;
        local_78 = uVar18;
      }
      else if (cVar2 == '>') {
        if (bVar9) {
          std::__cxx11::string::substr((ulong)local_c0,(ulong)line);
          trimStr((string *)&local_a0,(string *)local_c0);
          if ((string *)local_c0._0_8_ != (string *)(local_c0 + 0x10)) {
            operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
          }
          local_c0._0_8_ = (string *)(local_c0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c0,local_a0._M_allocated_capacity,
                     local_a0._8_8_ + local_a0._M_allocated_capacity);
          uVar8 = local_c0._8_8_;
          uVar7 = local_c0._0_8_;
          if ((string *)local_c0._8_8_ != (string *)0x0) {
            psVar20 = (string *)0x0;
            do {
              wVar10 = towlower((int)*(char *)(uVar7 + (long)psVar20));
              *(char *)(uVar7 + (long)psVar20) = (char)wVar10;
              psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 1);
            } while ((string *)uVar8 != psVar20);
          }
          iVar11 = std::__cxx11::string::compare((char *)local_c0);
          if ((iVar11 == 0) ||
             (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)) {
            local_70._32_8_ = local_70._32_8_ | 0x200000000;
LAB_001d1501:
            bVar9 = true;
LAB_001d1506:
            if (local_110 < local_78) {
              std::__cxx11::string::substr((ulong)&local_108,(ulong)line);
              std::
              vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
              ::emplace_back<text_subtitles::Font&,std::__cxx11::string&>
                        (local_80,(local_c8->
                                  super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + -1,&local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar9) {
              std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::push_back
                        (local_c8,&local_70);
            }
            else {
              uVar19 = ((long)(local_c8->
                              super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_c8->
                              super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
              if (1 < uVar19) {
                std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::resize
                          (local_c8,uVar19 - 1);
                pFVar17 = (local_c8->
                          super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                std::__cxx11::string::_M_assign((string *)&local_70);
                local_70.m_color = pFVar17[-1].m_color;
                local_70.m_lineSpacing = pFVar17[-1].m_lineSpacing;
                local_70.m_size = pFVar17[-1].m_size;
                local_70.m_opts = pFVar17[-1].m_opts;
                local_70.m_borderWidth = pFVar17[-1].m_borderWidth;
                local_70.m_charset = pFVar17[-1].m_charset;
              }
            }
            local_110 = uVar18 + 1;
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)local_c0);
            if ((iVar11 == 0) ||
               (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)) {
              local_70._32_8_ = local_70._32_8_ | 0x100000000;
              goto LAB_001d1501;
            }
            iVar11 = std::__cxx11::string::compare((char *)local_c0);
            if ((iVar11 == 0) ||
               (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)) {
              local_70._32_8_ = local_70._32_8_ | 0x400000000;
LAB_001d1650:
              bVar9 = true;
              goto LAB_001d1506;
            }
            iVar11 = std::__cxx11::string::compare((char *)local_c0);
            if ((iVar11 == 0) ||
               (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)) {
              local_70._32_8_ = local_70._32_8_ | 0x1000000000;
              goto LAB_001d1650;
            }
            iVar11 = std::__cxx11::string::compare((char *)local_c0);
            if (iVar11 == 0) {
              local_70._32_8_ = local_70._32_8_ | 0x800000000;
              goto LAB_001d1650;
            }
            iVar11 = std::__cxx11::string::compare((char *)local_c0);
            if ((((((iVar11 == 0) ||
                   (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)) ||
                  (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)) ||
                 ((iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0 ||
                  (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)))) ||
                ((iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0 ||
                 ((iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0 ||
                  (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)))))) ||
               (iVar11 = std::__cxx11::string::compare((char *)local_c0), iVar11 == 0)) {
LAB_001d14d8:
              bVar9 = false;
              goto LAB_001d1506;
            }
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"/font","");
            bVar9 = strStartWith((string *)&local_a0,&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar9) goto LAB_001d14d8;
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"font ","");
            bVar9 = strStartWith((string *)local_c0,&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar9) {
              paVar1 = &local_108.field_2;
              local_108._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"name","");
              _Var6._M_p = local_108._M_dataplus._M_p;
              sVar14 = anon_unknown.dwarf_356ee3::findUnquotedStr
                                 ((string *)local_c0._0_8_,(string *)local_c0._8_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p != paVar1) {
                operator_delete(_Var6._M_p,local_108.field_2._M_allocated_capacity + 1);
              }
              if (sVar14 == 0xffffffffffffffff) {
                local_108._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"face","");
                _Var6._M_p = local_108._M_dataplus._M_p;
                sVar14 = anon_unknown.dwarf_356ee3::findUnquotedStr
                                   ((string *)local_c0._0_8_,(string *)local_c0._8_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p != paVar1) {
                  operator_delete(_Var6._M_p,local_108.field_2._M_allocated_capacity + 1);
                }
                if (sVar14 != 0xffffffffffffffff) goto LAB_001d177b;
              }
              else {
LAB_001d177b:
                findFontArg(&local_e8,(string *)&local_a0,sVar14);
                unquoteStr(&local_108,&local_e8);
                std::__cxx11::string::operator=((string *)&local_70,(string *)&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != paVar1) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
              }
              local_108._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"color","");
              _Var6._M_p = local_108._M_dataplus._M_p;
              sVar14 = anon_unknown.dwarf_356ee3::findUnquotedStr
                                 ((string *)local_c0._0_8_,(string *)local_c0._8_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p != paVar1) {
                operator_delete(_Var6._M_p,local_108.field_2._M_allocated_capacity + 1);
              }
              if (sVar14 != 0xffffffffffffffff) {
                findFontArg(&local_e8,(string *)local_c0,sVar14);
                unquoteStr(&local_108,&local_e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                cVar15 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)(anonymous_namespace)::defaultPallette_abi_cxx11_,&local_108);
                if (cVar15.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                    ._M_cur == (__node_type *)0x0) {
LAB_001d18fc:
                  uVar12 = local_70.m_color;
                }
                else {
                  uVar12 = *(uint32_t *)
                            ((long)cVar15.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                   ._M_cur + 0x28);
                  local_70.m_color = uVar12;
                  if (local_108._M_string_length != 0) {
                    cVar2 = *local_108._M_dataplus._M_p;
                    if ((cVar2 == 'x') || (cVar2 == '#')) {
                      std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_108);
                      local_70.m_color = strToInt32u(local_e8._M_dataplus._M_p,0x10);
                    }
                    else {
                      if ((local_108._M_string_length == 1) ||
                         ((cVar2 != '0' && (local_108._M_dataplus._M_p[1] != 'x'))))
                      goto LAB_001d1940;
                      std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_108);
                      local_70.m_color = strToInt32u(local_e8._M_dataplus._M_p,0x10);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                      operator_delete(local_e8._M_dataplus._M_p,
                                      local_e8.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_001d18fc;
                  }
LAB_001d1940:
                  uVar12 = strToInt32u(local_108._M_dataplus._M_p,10);
                  local_70.m_color = uVar12;
                }
                if (uVar12 < 0x1000000) {
                  local_70._48_8_ = CONCAT44(local_70.m_lineSpacing,uVar12) | 0xff000000;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
              }
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"size","");
              _Var6._M_p = local_108._M_dataplus._M_p;
              sVar14 = anon_unknown.dwarf_356ee3::findUnquotedStr
                                 ((string *)local_c0._0_8_,(string *)local_c0._8_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p != &local_108.field_2) {
                operator_delete(_Var6._M_p,local_108.field_2._M_allocated_capacity + 1);
              }
              if (sVar14 != 0xffffffffffffffff) {
                findFontArg(&local_e8,(string *)&local_a0,sVar14);
                unquoteStr(&local_108,&local_e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                if (local_108._M_string_length != 0) {
                  if ((*local_108._M_dataplus._M_p == '-') || (*local_108._M_dataplus._M_p == '+'))
                  {
                    iVar13 = strToInt32(local_108._M_dataplus._M_p,10);
                    iVar11 = iVar13 + local_70.m_size;
                  }
                  else {
                    iVar11 = strToInt32(local_108._M_dataplus._M_p,10);
                  }
                  local_70.m_size = iVar11;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
              }
              goto LAB_001d1501;
            }
          }
          if ((string *)local_c0._0_8_ != (string *)(local_c0 + 0x10)) {
            operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_allocated_capacity != &local_90) {
            operator_delete((void *)local_a0._M_allocated_capacity,
                            local_90._M_allocated_capacity + 1);
          }
          uVar19 = line->_M_string_length;
        }
        bVar9 = false;
      }
      this = local_38;
      __return_storage_ptr__ =
           (vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_80;
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar19);
    if ((local_110 & 0xffffffff) < uVar19) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)line);
      std::
      vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
      ::emplace_back<text_subtitles::Font&,std::__cxx11::string>
                ((vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
                  *)__return_storage_ptr__,&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_allocated_capacity != &local_90) {
        operator_delete((void *)local_a0._M_allocated_capacity,local_90._M_allocated_capacity + 1);
      }
    }
  }
  ppVar16 = *(pointer *)__return_storage_ptr__;
  ppVar4 = *(pointer *)((long)__return_storage_ptr__ + 8);
  if (ppVar16 != ppVar4) {
    dVar5 = (double)(this->m_initFont).m_size;
    do {
      iVar11 = (ppVar16->first).m_size;
      dVar21 = dVar5;
      if (iVar11 < 4) {
        if (iVar11 != 3) {
          iVar11 = iVar11 + -3;
          do {
            dVar21 = dVar21 / 1.4142135623730951;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
        }
      }
      else {
        iVar11 = iVar11 + -3;
        do {
          dVar21 = dVar21 * 1.4142135623730951;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      (ppVar16->first).m_size = (int)dVar21;
      ppVar16 = ppVar16 + 1;
    } while (ppVar16 != ppVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != &local_70.m_name.field_2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  return (vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
             *)__return_storage_ptr__;
}

Assistant:

vector<pair<Font, string>> TextSubtitlesRender::processTxtLine(const std::string& line, vector<Font>& fontStack) const
{
    if (fontStack.empty())
    {
        fontStack.push_back(m_font);
        fontStack[0].m_size = DEFAULT_BROWSER_STYLE_FS;
    }
    Font curFont = fontStack[fontStack.size() - 1];

    vector<pair<Font, string>> rez;
    size_t prevTextPos = 0;
    size_t bStartPos = 0;
    bool bStartFound = false;
    for (size_t i = 0; i < line.size(); i++)
    {
        if (line[i] == '<')
        {
            bStartPos = i;
            bStartFound = true;
        }
        else if (line[i] == '>' && bStartFound)
        {
            bool isTag = false;
            bool endTag = false;
            string tagStr = trimStr(line.substr(bStartPos + 1, i - bStartPos - 1));
            string ltagStr = tagStr;
            for (auto& j : ltagStr) j = static_cast<char>(towlower(j));
            if (ltagStr == "i" || ltagStr == "italic")
            {
                curFont.m_opts |= Font::ITALIC;
                isTag = true;
            }
            else if (ltagStr == "b" || ltagStr == "bold")
            {
                curFont.m_opts |= Font::BOLD;
                isTag = true;
            }
            else if (ltagStr == "u" || ltagStr == "underline")
            {
                curFont.m_opts |= Font::UNDERLINE;
                isTag = true;
            }
            else if (ltagStr == "f" || ltagStr == "force")
            {
                curFont.m_opts |= Font::FORCED;
                isTag = true;
            }
            else if (ltagStr == "strike")
            {
                curFont.m_opts |= Font::STRIKE_OUT;
                isTag = true;
            }
            else if ((ltagStr == "/i" || ltagStr == "/italic") || (ltagStr == "/b" || ltagStr == "/bold") ||
                     (ltagStr == "/u" || ltagStr == "/underline") || (ltagStr == "/f" || ltagStr == "/force") ||
                     ltagStr == "/strike" || strStartWith(tagStr, "/font"))
            {
                endTag = true;
            }
            else if (strStartWith(ltagStr, "font "))
            {
                size_t fontNamePos = findUnquotedStr(ltagStr, "name");  // ltagStr.find("name");
                if (fontNamePos == string::npos)
                    fontNamePos = findUnquotedStr(ltagStr, "face");
                if (fontNamePos != string::npos)
                    curFont.m_name = unquoteStr(findFontArg(tagStr, fontNamePos /*, lastIndexPos*/));

                size_t colorPos = findUnquotedStr(ltagStr, "color");
                if (colorPos != string::npos)
                {
                    auto arg = unquoteStr(findFontArg(ltagStr, colorPos));
                    auto it = defaultPallette.find(arg);
                    if (it != std::end(defaultPallette))
                    {
                        curFont.m_color = it->second;
                        if (!arg.empty() && (arg[0] == '#' || arg[0] == 'x'))
                            curFont.m_color = strToInt32u(arg.substr(1, 16384).c_str(), 16);
                        else if (arg.size() > 1 && (arg[0] == '0' || arg[1] == 'x'))
                            curFont.m_color = strToInt32u(arg.substr(2, 16384).c_str(), 16);
                        else
                            curFont.m_color = strToInt32u(arg.c_str(), 10);
                    }
                    if ((curFont.m_color & 0xff000000u) == 0)
                        curFont.m_color |= 0xff000000u;
                }
                size_t fontSizePos = findUnquotedStr(ltagStr, "size");
                if (fontSizePos != string::npos)
                {
                    string arg = unquoteStr(findFontArg(tagStr, fontSizePos));
                    if (!arg.empty())
                    {
                        if (arg[0] == '+' || arg[0] == '-')
                            curFont.m_size += strToInt32(arg.c_str(), 10);
                        else
                            curFont.m_size = strToInt32(arg.c_str(), 10);
                    }
                }
                isTag = true;
            }
            if (isTag || endTag)
            {
                if (bStartPos > prevTextPos)
                {
                    string msg = line.substr(prevTextPos, bStartPos - prevTextPos);
                    rez.emplace_back(fontStack[fontStack.size() - 1], msg);
                }
                if (isTag)
                    fontStack.push_back(curFont);
                else if (fontStack.size() > 1)
                {
                    fontStack.resize(fontStack.size() - 1);
                    curFont = fontStack[fontStack.size() - 1];
                }
                prevTextPos = i + 1;
            }
            bStartFound = false;
        }
    }
    if (line.size() > static_cast<unsigned>(prevTextPos))
        rez.emplace_back(curFont, line.substr(prevTextPos, line.size() - prevTextPos));
    double rSize = m_initFont.m_size;
    for (auto& i : rez) i.first.m_size = browserSizeToRealSize(i.first.m_size, rSize);
    return rez;
}